

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * replaceArgEscapes(QString *__return_storage_ptr__,QStringView s,ArgEscapeData *d,
                           qsizetype field_width,QStringView arg,QStringView larg,QChar fillChar)

{
  storage_type_conflict *psVar1;
  storage_type_conflict sVar2;
  long lVar3;
  char16_t *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  storage_type_conflict *psVar14;
  int iVar15;
  QStringView *pQVar16;
  ulong uVar17;
  qsizetype qVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  char16_t *__dest;
  storage_type_conflict *psVar22;
  qsizetype qVar23;
  void *__dest_00;
  long lVar24;
  long lVar25;
  storage_type_conflict *psVar26;
  size_t __n;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar56;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar62;
  int iVar67;
  undefined1 in_XMM5 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar68 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  long local_48;
  
  lVar20 = s.m_size;
  psVar22 = s.m_data;
  lVar24 = -field_width;
  if (0 < field_width) {
    lVar24 = field_width;
  }
  lVar3 = d->escape_len;
  lVar25 = d->occurrences;
  lVar21 = d->locale_occurrences;
  qVar18 = arg.m_size;
  if (arg.m_size < lVar24) {
    qVar18 = lVar24;
  }
  qVar23 = larg.m_size;
  if (larg.m_size < lVar24) {
    qVar23 = lVar24;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,
                   qVar23 * lVar21 + qVar18 * (lVar25 - lVar21) + (lVar20 - lVar3),
                   (Initialization)lVar21);
  if (lVar20 != 0) {
    psVar1 = psVar22 + lVar20;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    __dest = L"";
    if (pcVar4 != (char16_t *)0x0) {
      __dest = pcVar4;
    }
    lVar20 = lVar24 * 2 + -2;
    local_48 = 0;
    do {
      __n = 0xfffffffffffffffe;
      psVar14 = psVar22;
      do {
        psVar26 = psVar14;
        __n = __n + 2;
        psVar14 = psVar26 + 1;
      } while (*psVar26 != L'%');
      sVar2 = *psVar14;
      psVar26 = psVar26 + 2;
      if (sVar2 != L'L') {
        psVar26 = psVar14;
      }
      iVar15 = (ushort)*psVar26 - 0x30;
      if (9 < (ushort)iVar15) {
        iVar15 = -1;
      }
      if (iVar15 == -1) {
        iVar15 = -1;
      }
      else if (psVar26 + 1 != psVar1) {
        iVar19 = (ushort)psVar26[1] - 0x30;
        if (9 < (ushort)iVar19) {
          iVar19 = -1;
        }
        if (iVar19 != -1) {
          psVar26 = psVar26 + 1;
          iVar15 = iVar19 + iVar15 * 10;
        }
      }
      if (iVar15 == d->min_escape) {
        memcpy(__dest,psVar22,__n);
        auVar74 = _DAT_00131590;
        auVar73 = _DAT_00131580;
        auVar72 = _DAT_00131570;
        auVar71 = _DAT_00131560;
        auVar70 = _DAT_00131550;
        __dest_00 = (void *)(__n + (long)__dest);
        pQVar16 = &arg;
        if (sVar2 == L'L') {
          pQVar16 = &larg;
        }
        psVar22 = pQVar16->m_data;
        lVar3 = pQVar16->m_size;
        lVar25 = lVar24 - lVar3;
        if ((0 < field_width) && (0 < lVar25)) {
          lVar27 = (long)__n >> 1;
          __dest_00 = (void *)((long)__dest_00 + lVar25 * 2);
          uVar17 = lVar20 + lVar3 * -2;
          auVar34._8_4_ = (int)uVar17;
          auVar34._0_8_ = uVar17;
          auVar34._12_4_ = (int)(uVar17 >> 0x20);
          auVar64._0_8_ = uVar17 >> 1;
          auVar64._8_8_ = auVar34._8_8_ >> 1;
          lVar21 = 0;
          do {
            auVar51._8_4_ = (int)lVar21;
            auVar51._0_8_ = lVar21;
            auVar51._12_4_ = (int)((ulong)lVar21 >> 0x20);
            auVar34 = auVar64 ^ auVar74;
            auVar43 = (auVar51 | auVar73) ^ auVar74;
            iVar15 = auVar34._0_4_;
            iVar62 = -(uint)(iVar15 < auVar43._0_4_);
            iVar19 = auVar34._4_4_;
            auVar44._4_4_ = -(uint)(iVar19 < auVar43._4_4_);
            iVar56 = auVar34._8_4_;
            iVar67 = -(uint)(iVar56 < auVar43._8_4_);
            iVar30 = auVar34._12_4_;
            auVar44._12_4_ = -(uint)(iVar30 < auVar43._12_4_);
            auVar58._4_4_ = iVar62;
            auVar58._0_4_ = iVar62;
            auVar58._8_4_ = iVar67;
            auVar58._12_4_ = iVar67;
            auVar34 = pshuflw(in_XMM6,auVar58,0xe8);
            auVar46._4_4_ = -(uint)(auVar43._4_4_ == iVar19);
            auVar46._12_4_ = -(uint)(auVar43._12_4_ == iVar30);
            auVar46._0_4_ = auVar46._4_4_;
            auVar46._8_4_ = auVar46._12_4_;
            auVar69 = pshuflw(in_XMM7,auVar46,0xe8);
            auVar44._0_4_ = auVar44._4_4_;
            auVar44._8_4_ = auVar44._12_4_;
            auVar68 = pshuflw(auVar34,auVar44,0xe8);
            auVar43._8_4_ = 0xffffffff;
            auVar43._0_8_ = 0xffffffffffffffff;
            auVar43._12_4_ = 0xffffffff;
            auVar43 = (auVar68 | auVar69 & auVar34) ^ auVar43;
            auVar43 = packssdw(auVar43,auVar43);
            if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              __dest[lVar27 + lVar21] = fillChar.ucs;
            }
            auVar44 = auVar46 & auVar58 | auVar44;
            auVar43 = packssdw(auVar44,auVar44);
            auVar68._8_4_ = 0xffffffff;
            auVar68._0_8_ = 0xffffffffffffffff;
            auVar68._12_4_ = 0xffffffff;
            auVar43 = packssdw(auVar43 ^ auVar68,auVar43 ^ auVar68);
            if ((auVar43._0_4_ >> 0x10 & 1) != 0) {
              __dest[lVar27 + lVar21 + 1] = fillChar.ucs;
            }
            auVar43 = (auVar51 | auVar72) ^ auVar74;
            iVar62 = -(uint)(iVar15 < auVar43._0_4_);
            auVar63._4_4_ = -(uint)(iVar19 < auVar43._4_4_);
            iVar67 = -(uint)(iVar56 < auVar43._8_4_);
            auVar63._12_4_ = -(uint)(iVar30 < auVar43._12_4_);
            auVar45._4_4_ = iVar62;
            auVar45._0_4_ = iVar62;
            auVar45._8_4_ = iVar67;
            auVar45._12_4_ = iVar67;
            auVar57._4_4_ = -(uint)(auVar43._4_4_ == iVar19);
            auVar57._12_4_ = -(uint)(auVar43._12_4_ == iVar30);
            auVar57._0_4_ = auVar57._4_4_;
            auVar57._8_4_ = auVar57._12_4_;
            auVar63._0_4_ = auVar63._4_4_;
            auVar63._8_4_ = auVar63._12_4_;
            auVar43 = auVar57 & auVar45 | auVar63;
            auVar43 = packssdw(auVar43,auVar43);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar43 = packssdw(auVar43 ^ auVar5,auVar43 ^ auVar5);
            if ((auVar43 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              __dest[lVar27 + lVar21 + 2] = fillChar.ucs;
            }
            auVar46 = pshufhw(auVar45,auVar45,0x84);
            auVar58 = pshufhw(auVar57,auVar57,0x84);
            auVar44 = pshufhw(auVar46,auVar63,0x84);
            auVar47._8_4_ = 0xffffffff;
            auVar47._0_8_ = 0xffffffffffffffff;
            auVar47._12_4_ = 0xffffffff;
            auVar47 = (auVar44 | auVar58 & auVar46) ^ auVar47;
            auVar46 = packssdw(auVar47,auVar47);
            if ((auVar46 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              __dest[lVar27 + lVar21 + 3] = fillChar.ucs;
            }
            auVar46 = (auVar51 | auVar71) ^ auVar74;
            iVar62 = -(uint)(iVar15 < auVar46._0_4_);
            auVar49._4_4_ = -(uint)(iVar19 < auVar46._4_4_);
            iVar67 = -(uint)(iVar56 < auVar46._8_4_);
            auVar49._12_4_ = -(uint)(iVar30 < auVar46._12_4_);
            auVar59._4_4_ = iVar62;
            auVar59._0_4_ = iVar62;
            auVar59._8_4_ = iVar67;
            auVar59._12_4_ = iVar67;
            auVar43 = pshuflw(auVar43,auVar59,0xe8);
            auVar48._4_4_ = -(uint)(auVar46._4_4_ == iVar19);
            auVar48._12_4_ = -(uint)(auVar46._12_4_ == iVar30);
            auVar48._0_4_ = auVar48._4_4_;
            auVar48._8_4_ = auVar48._12_4_;
            in_XMM7 = pshuflw(auVar69 & auVar34,auVar48,0xe8);
            in_XMM7 = in_XMM7 & auVar43;
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar34 = pshuflw(auVar43,auVar49,0xe8);
            auVar69._8_4_ = 0xffffffff;
            auVar69._0_8_ = 0xffffffffffffffff;
            auVar69._12_4_ = 0xffffffff;
            auVar69 = (auVar34 | in_XMM7) ^ auVar69;
            in_XMM6 = packssdw(auVar69,auVar69);
            if ((in_XMM6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              __dest[lVar27 + lVar21 + 4] = fillChar.ucs;
            }
            auVar49 = auVar48 & auVar59 | auVar49;
            auVar34 = packssdw(auVar49,auVar49);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar6,auVar34 ^ auVar6);
            if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              __dest[lVar27 + lVar21 + 5] = fillChar.ucs;
            }
            auVar34 = (auVar51 | auVar70) ^ auVar74;
            auVar60._0_4_ = -(uint)(iVar15 < auVar34._0_4_);
            auVar60._4_4_ = -(uint)(iVar19 < auVar34._4_4_);
            auVar60._8_4_ = -(uint)(iVar56 < auVar34._8_4_);
            auVar60._12_4_ = -(uint)(iVar30 < auVar34._12_4_);
            auVar50._4_4_ = auVar60._0_4_;
            auVar50._0_4_ = auVar60._0_4_;
            auVar50._8_4_ = auVar60._8_4_;
            auVar50._12_4_ = auVar60._8_4_;
            auVar31._4_4_ = -(uint)(auVar34._4_4_ == iVar19);
            auVar31._12_4_ = -(uint)(auVar34._12_4_ == iVar30);
            auVar31._0_4_ = auVar31._4_4_;
            auVar31._8_4_ = auVar31._12_4_;
            auVar35._4_4_ = auVar60._4_4_;
            auVar35._0_4_ = auVar60._4_4_;
            auVar35._8_4_ = auVar60._12_4_;
            auVar35._12_4_ = auVar60._12_4_;
            in_XMM5 = auVar31 & auVar50 | auVar35;
            auVar34 = packssdw(auVar60,in_XMM5);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar7,auVar34 ^ auVar7);
            if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              __dest[lVar27 + lVar21 + 6] = fillChar.ucs;
            }
            auVar51 = pshufhw(auVar50,auVar50,0x84);
            auVar34 = pshufhw(auVar31,auVar31,0x84);
            auVar43 = pshufhw(auVar35,auVar35,0x84);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 & auVar51,(auVar43 | auVar34 & auVar51) ^ auVar8);
            if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              __dest[lVar27 + lVar21 + 7] = fillChar.ucs;
            }
            lVar21 = lVar21 + 8;
          } while ((uVar17 >> 1 & 0x7ffffffffffffff8) + 8 != lVar21);
        }
        if (lVar3 != 0) {
          memcpy(__dest_00,psVar22,lVar3 * 2);
          auVar70 = _DAT_00131550;
          auVar71 = _DAT_00131560;
          auVar72 = _DAT_00131570;
          auVar73 = _DAT_00131580;
          auVar74 = _DAT_00131590;
        }
        __dest = (char16_t *)((long)__dest_00 + lVar3 * 2);
        if ((field_width < 0) && (0 < lVar25)) {
          __dest = (char16_t *)((long)__dest_00 + lVar24 * 2);
          uVar17 = lVar20 + lVar3 * -2;
          auVar28._8_4_ = (int)uVar17;
          auVar28._0_8_ = uVar17;
          auVar28._12_4_ = (int)(uVar17 >> 0x20);
          auVar29._0_8_ = uVar17 >> 1;
          auVar29._8_8_ = auVar28._8_8_ >> 1;
          auVar29 = auVar29 ^ auVar74;
          lVar25 = 0;
          do {
            auVar32._8_4_ = (int)lVar25;
            auVar32._0_8_ = lVar25;
            auVar32._12_4_ = (int)((ulong)lVar25 >> 0x20);
            auVar34 = (auVar32 | auVar73) ^ auVar74;
            iVar15 = auVar29._0_4_;
            iVar62 = -(uint)(iVar15 < auVar34._0_4_);
            iVar19 = auVar29._4_4_;
            auVar37._4_4_ = -(uint)(iVar19 < auVar34._4_4_);
            iVar56 = auVar29._8_4_;
            iVar67 = -(uint)(iVar56 < auVar34._8_4_);
            iVar30 = auVar29._12_4_;
            auVar37._12_4_ = -(uint)(iVar30 < auVar34._12_4_);
            auVar52._4_4_ = iVar62;
            auVar52._0_4_ = iVar62;
            auVar52._8_4_ = iVar67;
            auVar52._12_4_ = iVar67;
            auVar64 = pshuflw(in_XMM5,auVar52,0xe8);
            auVar36._4_4_ = -(uint)(auVar34._4_4_ == iVar19);
            auVar36._12_4_ = -(uint)(auVar34._12_4_ == iVar30);
            auVar36._0_4_ = auVar36._4_4_;
            auVar36._8_4_ = auVar36._12_4_;
            auVar43 = pshuflw(in_XMM6,auVar36,0xe8);
            auVar37._0_4_ = auVar37._4_4_;
            auVar37._8_4_ = auVar37._12_4_;
            auVar34 = pshuflw(auVar64,auVar37,0xe8);
            auVar65._8_4_ = 0xffffffff;
            auVar65._0_8_ = 0xffffffffffffffff;
            auVar65._12_4_ = 0xffffffff;
            auVar65 = (auVar34 | auVar43 & auVar64) ^ auVar65;
            auVar34 = packssdw(auVar65,auVar65);
            if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(char16_t *)((long)__dest_00 + lVar25 * 2 + lVar3 * 2) = fillChar.ucs;
            }
            auVar37 = auVar36 & auVar52 | auVar37;
            auVar34 = packssdw(auVar37,auVar37);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar9,auVar34 ^ auVar9);
            if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
              *(char16_t *)((long)__dest_00 + lVar25 * 2 + lVar3 * 2 + 2) = fillChar.ucs;
            }
            auVar34 = (auVar32 | auVar72) ^ auVar74;
            iVar62 = -(uint)(iVar15 < auVar34._0_4_);
            auVar61._4_4_ = -(uint)(iVar19 < auVar34._4_4_);
            iVar67 = -(uint)(iVar56 < auVar34._8_4_);
            auVar61._12_4_ = -(uint)(iVar30 < auVar34._12_4_);
            auVar38._4_4_ = iVar62;
            auVar38._0_4_ = iVar62;
            auVar38._8_4_ = iVar67;
            auVar38._12_4_ = iVar67;
            auVar53._4_4_ = -(uint)(auVar34._4_4_ == iVar19);
            auVar53._12_4_ = -(uint)(auVar34._12_4_ == iVar30);
            auVar53._0_4_ = auVar53._4_4_;
            auVar53._8_4_ = auVar53._12_4_;
            auVar61._0_4_ = auVar61._4_4_;
            auVar61._8_4_ = auVar61._12_4_;
            auVar34 = auVar53 & auVar38 | auVar61;
            auVar34 = packssdw(auVar34,auVar34);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar10,auVar34 ^ auVar10);
            if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(char16_t *)((long)__dest_00 + lVar25 * 2 + lVar3 * 2 + 4) = fillChar.ucs;
            }
            auVar51 = pshufhw(auVar38,auVar38,0x84);
            auVar44 = pshufhw(auVar53,auVar53,0x84);
            auVar46 = pshufhw(auVar51,auVar61,0x84);
            auVar39._8_4_ = 0xffffffff;
            auVar39._0_8_ = 0xffffffffffffffff;
            auVar39._12_4_ = 0xffffffff;
            auVar39 = (auVar46 | auVar44 & auVar51) ^ auVar39;
            auVar51 = packssdw(auVar39,auVar39);
            if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(char16_t *)((long)__dest_00 + lVar25 * 2 + lVar3 * 2 + 6) = fillChar.ucs;
            }
            auVar51 = (auVar32 | auVar71) ^ auVar74;
            iVar62 = -(uint)(iVar15 < auVar51._0_4_);
            auVar41._4_4_ = -(uint)(iVar19 < auVar51._4_4_);
            iVar67 = -(uint)(iVar56 < auVar51._8_4_);
            auVar41._12_4_ = -(uint)(iVar30 < auVar51._12_4_);
            auVar54._4_4_ = iVar62;
            auVar54._0_4_ = iVar62;
            auVar54._8_4_ = iVar67;
            auVar54._12_4_ = iVar67;
            auVar34 = pshuflw(auVar34,auVar54,0xe8);
            auVar40._4_4_ = -(uint)(auVar51._4_4_ == iVar19);
            auVar40._12_4_ = -(uint)(auVar51._12_4_ == iVar30);
            auVar40._0_4_ = auVar40._4_4_;
            auVar40._8_4_ = auVar40._12_4_;
            in_XMM6 = pshuflw(auVar43 & auVar64,auVar40,0xe8);
            in_XMM6 = in_XMM6 & auVar34;
            auVar41._0_4_ = auVar41._4_4_;
            auVar41._8_4_ = auVar41._12_4_;
            auVar34 = pshuflw(auVar34,auVar41,0xe8);
            auVar66._8_4_ = 0xffffffff;
            auVar66._0_8_ = 0xffffffffffffffff;
            auVar66._12_4_ = 0xffffffff;
            auVar66 = (auVar34 | in_XMM6) ^ auVar66;
            in_XMM5 = packssdw(auVar66,auVar66);
            if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(char16_t *)((long)__dest_00 + lVar25 * 2 + lVar3 * 2 + 8) = fillChar.ucs;
            }
            auVar41 = auVar40 & auVar54 | auVar41;
            auVar34 = packssdw(auVar41,auVar41);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar11,auVar34 ^ auVar11);
            if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(char16_t *)((long)__dest_00 + lVar25 * 2 + lVar3 * 2 + 10) = fillChar.ucs;
            }
            auVar34 = (auVar32 | auVar70) ^ auVar74;
            iVar15 = -(uint)(iVar15 < auVar34._0_4_);
            auVar55._4_4_ = -(uint)(iVar19 < auVar34._4_4_);
            iVar56 = -(uint)(iVar56 < auVar34._8_4_);
            auVar55._12_4_ = -(uint)(iVar30 < auVar34._12_4_);
            auVar42._4_4_ = iVar15;
            auVar42._0_4_ = iVar15;
            auVar42._8_4_ = iVar56;
            auVar42._12_4_ = iVar56;
            auVar33._4_4_ = -(uint)(auVar34._4_4_ == iVar19);
            auVar33._12_4_ = -(uint)(auVar34._12_4_ == iVar30);
            auVar33._0_4_ = auVar33._4_4_;
            auVar33._8_4_ = auVar33._12_4_;
            auVar55._0_4_ = auVar55._4_4_;
            auVar55._8_4_ = auVar55._12_4_;
            auVar34 = auVar33 & auVar42 | auVar55;
            auVar34 = packssdw(auVar34,auVar34);
            auVar12._8_4_ = 0xffffffff;
            auVar12._0_8_ = 0xffffffffffffffff;
            auVar12._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar12,auVar34 ^ auVar12);
            if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(char16_t *)((long)__dest_00 + lVar25 * 2 + lVar3 * 2 + 0xc) = fillChar.ucs;
            }
            auVar64 = pshufhw(auVar42,auVar42,0x84);
            auVar34 = pshufhw(auVar33,auVar33,0x84);
            auVar43 = pshufhw(auVar64,auVar55,0x84);
            auVar13._8_4_ = 0xffffffff;
            auVar13._0_8_ = 0xffffffffffffffff;
            auVar13._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 & auVar64,(auVar43 | auVar34 & auVar64) ^ auVar13);
            if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(char16_t *)((long)__dest_00 + lVar25 * 2 + lVar3 * 2 + 0xe) = fillChar.ucs;
            }
            lVar25 = lVar25 + 8;
          } while ((uVar17 >> 1 & 0x7ffffffffffffff8) + 8 != lVar25);
        }
        psVar22 = psVar26 + 1;
        local_48 = local_48 + 1;
        if (local_48 == d->occurrences) {
          memcpy(__dest,psVar22,(long)psVar1 - (long)psVar22);
          __dest = (char16_t *)((long)__dest + ((long)psVar1 - (long)psVar22));
          psVar22 = psVar1;
        }
      }
      else {
        memcpy(__dest,psVar22,(long)psVar26 - (long)psVar22);
        __dest = (char16_t *)((long)__dest + ((long)psVar26 - (long)psVar22));
        psVar22 = psVar26;
      }
    } while (psVar22 != psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static QString replaceArgEscapes(QStringView s, const ArgEscapeData &d, qsizetype field_width,
                                 QStringView arg, QStringView larg, QChar fillChar)
{
    // Negative field-width for right-padding, positive for left-padding:
    const qsizetype abs_field_width = qAbs(field_width);
    const qsizetype result_len =
            s.size() - d.escape_len
            + (d.occurrences - d.locale_occurrences) * qMax(abs_field_width, arg.size())
            + d.locale_occurrences * qMax(abs_field_width, larg.size());

    QString result(result_len, Qt::Uninitialized);
    QChar *rc = const_cast<QChar *>(result.unicode());
    QChar *const result_end = rc + result_len;
    qsizetype repl_cnt = 0;

    const QChar *c = s.begin();
    const QChar *const uc_end = s.end();
    while (c != uc_end) {
        Q_ASSERT(d.occurrences > repl_cnt);
        /* We don't have to check increments of c against uc_end because, as
           long as d.occurrences > repl_cnt, we KNOW there are valid escape
           sequences remaining. */

        const QChar *text_start = c;
        while (c->unicode() != '%')
            ++c;

        const QChar *escape_start = c++;
        const bool localize = c->unicode() == 'L';
        if (localize)
            ++c;

        int escape = qArgDigitValue(*c);
        if (escape != -1 && c + 1 != uc_end) {
            const int digit = qArgDigitValue(c[1]);
            if (digit != -1) {
                ++c;
                escape = 10 * escape + digit;
            }
        }

        if (escape != d.min_escape) {
            memcpy(rc, text_start, (c - text_start) * sizeof(QChar));
            rc += c - text_start;
        } else {
            ++c;

            memcpy(rc, text_start, (escape_start - text_start) * sizeof(QChar));
            rc += escape_start - text_start;

            const QStringView use = localize ? larg : arg;
            const qsizetype pad_chars = abs_field_width - use.size();
            // (If negative, relevant loops are no-ops: no need to check.)

            if (field_width > 0) { // left padded
                rc = std::fill_n(rc, pad_chars, fillChar);
            }

            if (use.size())
                memcpy(rc, use.data(), use.size() * sizeof(QChar));
            rc += use.size();

            if (field_width < 0) { // right padded
                rc = std::fill_n(rc, pad_chars, fillChar);
            }

            if (++repl_cnt == d.occurrences) {
                memcpy(rc, c, (uc_end - c) * sizeof(QChar));
                rc += uc_end - c;
                Q_ASSERT(rc == result_end);
                c = uc_end;
            }
        }
    }
    Q_ASSERT(rc == result_end);

    return result;
}